

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

Signature __thiscall
wasm::WasmBinaryBuilder::getSignatureByFunctionIndex(WasmBinaryBuilder *this,Index index)

{
  bool bVar1;
  Signature SVar2;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  HeapType local_30;
  HeapType heapType;
  Index index_local;
  WasmBinaryBuilder *this_local;
  
  heapType.id._4_4_ = index;
  local_30 = getTypeByFunctionIndex(this,index);
  bVar1 = HeapType::isSignature(&local_30);
  if (!bVar1) {
    HeapType::toString_abi_cxx11_(&local_70,&local_30);
    std::operator+(&local_50,"invalid signature type ",&local_70);
    throwError(this,&local_50);
  }
  SVar2 = HeapType::getSignature(&local_30);
  return SVar2;
}

Assistant:

Signature WasmBinaryBuilder::getSignatureByFunctionIndex(Index index) {
  auto heapType = getTypeByFunctionIndex(index);
  if (!heapType.isSignature()) {
    throwError("invalid signature type " + heapType.toString());
  }
  return heapType.getSignature();
}